

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall GibbsSamplerFromHDP::storeSamples(GibbsSamplerFromHDP *this)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  long lVar7;
  pointer pvVar8;
  int k_1;
  ulong uVar9;
  int k;
  ulong uVar10;
  int v;
  ulong uVar11;
  int t;
  
  this->_samplingCount = this->_samplingCount + 1;
  uVar1 = this->_K;
  puVar3 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->_sumOfNkSampled).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
    pdVar4[uVar10] = (double)puVar3[uVar10] + pdVar4[uVar10];
  }
  uVar2 = this->_V;
  for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
    pvVar5 = (this->_nkv).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->_sumOfNkvSampled).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      lVar7 = *(long *)&pvVar6[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar7 + uVar11 * 8) =
           (double)*(uint *)(*(long *)&pvVar5[uVar10].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + uVar11 * 4) +
           *(double *)(lVar7 + uVar11 * 8);
    }
  }
  uVar1 = this->_J;
  puVar3 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
    uVar2 = puVar3[uVar10];
    pvVar5 = (this->_njt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->_sumOfNjkSampled).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      uVar9 = (ulong)*(uint *)(*(long *)&pvVar8[uVar10].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + uVar11 * 4);
      lVar7 = *(long *)&pvVar6[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar7 + uVar9 * 8) =
           (double)*(uint *)(*(long *)&pvVar5[uVar10].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + uVar11 * 4) +
           *(double *)(lVar7 + uVar9 * 8);
    }
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::storeSamples(){//{{{
    _samplingCount++;
    for(int k=0; k<_K; k++){
        _sumOfNkSampled[k] += _nk[k];
    }
    //nkv
    for(int k=0; k<_K; k++){
        for(int v=0; v<_V; v++){
            _sumOfNkvSampled[k][v] += _nkv[k][v];
        }
    }
    //njk
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _sumOfNjkSampled[j][_kjt[j][t]] += _njt[j][t];
        }
    }
}